

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cpp
# Opt level: O2

void rw::writeBMP(Image *image,char *filename)

{
  undefined4 uVar1;
  FILE *__stream;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  char *pcVar4;
  byte bVar5;
  int x;
  int iVar6;
  Error *data;
  int i;
  long lVar7;
  byte *pbVar8;
  long lVar9;
  byte *pbVar10;
  StreamFile local_88;
  BMPheader bmp;
  Error _e;
  
  local_88.super_Stream._vptr_Stream = (_func_int **)&PTR__Stream_00144c40;
  local_88.file = (FILE *)0x0;
  iVar2 = StreamFile::open(&local_88,filename,0x12ff8d);
  if (CONCAT44(extraout_var,iVar2) == 0) {
    _e.plugin = 0;
    _e.code = 0x80000003;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/bmp.cpp",
            0xcb);
    __stream = _stderr;
    pcVar4 = dbgsprint(0x80000003,filename);
    fprintf(__stream,"%s\n",pcVar4);
    setError(&_e);
  }
  else {
    iVar2 = image->depth;
    lVar9 = 0x100;
    if (iVar2 == 4) {
      lVar9 = 0x10;
    }
    lVar7 = 0;
    if (8 < iVar2) {
      lVar9 = 0;
    }
    iVar2 = image->width * iVar2;
    bmp.magic = 0x4d42;
    bmp.offset = (int)lVar9 * 4 + 0x36;
    bmp.size = (iVar2 / 8 + 3U & 0xfffffffc) * image->height + (int)lVar9 * 4 + 0x36;
    bmp.reserved[0] = 0;
    bmp.reserved[1] = 0;
    BMPheader::write(&bmp,(int)&local_88,(void *)((long)iVar2 % 8 & 0xffffffff),(ulong)bmp.offset);
    data = &_e;
    _e.plugin = 0x28;
    uVar1 = image->width;
    _e.code = uVar1;
    StreamFile::write8(&local_88,data,0x28);
    for (; lVar9 != lVar7; lVar7 = lVar7 + 1) {
      Stream::writeU8(&local_88.super_Stream,image->palette[lVar7 * 4 + 2]);
      Stream::writeU8(&local_88.super_Stream,image->palette[lVar7 * 4 + 1]);
      Stream::writeU8(&local_88.super_Stream,image->palette[lVar7 * 4]);
      data = (Error *)0xff;
      Stream::writeU8(&local_88.super_Stream,0xff);
    }
    uVar3 = (ulong)image->height;
    pbVar8 = image->pixels + (long)image->stride * (uVar3 - 1);
    for (iVar2 = 0; iVar2 < (int)uVar3; iVar2 = iVar2 + 1) {
      pbVar10 = pbVar8;
      for (iVar6 = 0; iVar6 < image->width; iVar6 = iVar6 + 1) {
        switch(image->depth << 0x1e | image->depth - 4U >> 2) {
        case 0:
          bVar5 = pbVar10[1] & 0xf | *pbVar10 << 4;
          data = (Error *)(ulong)bVar5;
          Stream::writeU8(&local_88.super_Stream,bVar5);
          pbVar10 = pbVar10 + 2;
          iVar6 = iVar6 + 1;
          break;
        case 1:
          bVar5 = *pbVar10;
          data = (Error *)(ulong)bVar5;
          pbVar10 = pbVar10 + 1;
          Stream::writeU8(&local_88.super_Stream,bVar5);
          break;
        case 3:
          Stream::writeU8(&local_88.super_Stream,*pbVar10);
          data = (Error *)(ulong)pbVar10[1];
          Stream::writeU8(&local_88.super_Stream,pbVar10[1]);
          pbVar10 = pbVar10 + 2;
          break;
        case 5:
          Stream::writeU8(&local_88.super_Stream,pbVar10[2]);
          Stream::writeU8(&local_88.super_Stream,pbVar10[1]);
          data = (Error *)(ulong)*pbVar10;
          Stream::writeU8(&local_88.super_Stream,*pbVar10);
          pbVar10 = pbVar10 + 3;
          break;
        case 7:
          Stream::writeU8(&local_88.super_Stream,pbVar10[2]);
          Stream::writeU8(&local_88.super_Stream,pbVar10[1]);
          data = (Error *)(ulong)*pbVar10;
          Stream::writeU8(&local_88.super_Stream,*pbVar10);
          pbVar10 = pbVar10 + 4;
        }
      }
      uVar3 = ((long)pbVar10 - (long)pbVar8) % 4;
      while (iVar6 = (int)uVar3, uVar3 = (ulong)(iVar6 - 1), iVar6 != 0) {
        data = (Error *)0x0;
        Stream::writeU8(&local_88.super_Stream,'\0');
      }
      pbVar8 = pbVar8 + -(long)image->stride;
      uVar3 = (ulong)(uint)image->height;
    }
    StreamFile::close(&local_88,(int)data);
  }
  return;
}

Assistant:

void
writeBMP(Image *image, const char *filename)
{
	ASSERTLITTLE;
	uint8 *p;
	StreamFile file;
	if(!file.open(filename, "wb")){
		RWERROR((ERR_FILE, filename));
		return;
	}

	int32 pallen = image->depth > 8  ? 0 :
	               image->depth == 4 ? 16 : 256;
	int32 stride = image->width*image->depth/8;
	int32 depth = image->depth == 32 ? 24 : image->depth;
	stride = stride+3 & ~3;

	// File headers
	BMPheader bmp;
	bmp.magic = 0x4D42;	// BM
	bmp.size = 0x36 + 4*pallen + image->height*stride;
	bmp.reserved[0] = 0;
	bmp.reserved[1] = 0;
	bmp.offset = 0x36 + 4*pallen;
	bmp.write(&file);

	DIBheader dib;
	dib.headerSize = 0x28;
	dib.width = image->width;
	dib.height = image->height;
	dib.numPlanes = 1;
	dib.depth = depth;
	dib.compression = 0;
	dib.imgSize = 0;
	dib.hres = 2835;	// 72dpi
	dib.vres = 2835;	// 72dpi
	dib.paletteLen = 0;
	dib.numImportant = 0;
	file.write8(&dib, dib.headerSize);

	for(int i = 0; i < pallen; i++){
		file.writeU8(image->palette[i*4+2]);
		file.writeU8(image->palette[i*4+1]);
		file.writeU8(image->palette[i*4+0]);
		file.writeU8(0xFF);
	}

	uint8 *line = image->pixels + (image->height-1)*image->stride;
	int32 n;
	for(int y = 0; y < image->height; y++){
		p = line;
		for(int x = 0; x < image->width; x++){
			switch(image->depth){
			case 4:
				file.writeU8((p[0]&0xF)<<4 | (p[1]&0xF));
				p += 2;
				x++;
				break;
			case 8:
				file.writeU8(*p++);
				break;
			case 16:
				file.writeU8(p[0]);
				file.writeU8(p[1]);
				p += 2;
				break;
			case 24:
				file.writeU8(p[2]);
				file.writeU8(p[1]);
				file.writeU8(p[0]);
				p += 3;
				break;
			case 32:
				file.writeU8(p[2]);
				file.writeU8(p[1]);
				file.writeU8(p[0]);
				p += 4;
			}
		}
		n = (p-line) % 4;
		while(n--)
			file.writeU8(0);
		line -= image->stride;
	}

	file.close();
}